

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O1

void __thiscall Fl_Browser_::draw(Fl_Browser_ *this)

{
  uchar *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Fl_Slider *pFVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined8 uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int H;
  int W;
  int Y;
  int X;
  int local_8c;
  uint local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  uint local_74;
  ulong local_70;
  int local_68;
  uint local_64;
  ulong local_60;
  uint local_54;
  Fl_Slider *local_50;
  Fl_Slider *local_48;
  void **local_40;
  Fl_Browser_ *local_38;
  undefined4 extraout_var_01;
  
  update_top(this);
  local_78 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])(this);
  iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
  bbox(this,(int *)&local_7c,(int *)&local_80,(int *)&local_88,&local_8c);
  local_40 = &this->redraw1;
  local_48 = &(this->scrollbar).super_Fl_Slider;
  local_50 = &(this->hscrollbar).super_Fl_Slider;
  uVar11 = CONCAT71((int7)((ulong)local_50 >> 8),1);
  bVar4 = false;
  local_38 = this;
  do {
    local_54 = (uint)uVar11;
    if ((char)(this->super_Fl_Group).super_Fl_Widget.damage_ < '\0') {
      bVar6 = (this->super_Fl_Group).super_Fl_Widget.box_;
      if (bVar6 == 0) {
        bVar6 = 3;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar6,(this->super_Fl_Group).super_Fl_Widget.x_,
                          (this->super_Fl_Group).super_Fl_Widget.y_,
                          (this->super_Fl_Group).super_Fl_Widget.w_,
                          (this->super_Fl_Group).super_Fl_Widget.h_,
                          (this->super_Fl_Group).super_Fl_Widget.color_);
      bVar4 = true;
    }
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (iVar7 <= local_8c)))) {
      iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      this->top_ = (void *)CONCAT44(extraout_var,iVar8);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar9 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar9 & 2) == 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar9 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar9 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar9 & 2) != 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar9 & 0xfffffffd;
        bbox(this,(int *)&local_7c,(int *)&local_80,(int *)&local_88,&local_8c);
        bVar4 = true;
      }
    }
    if (((this->has_scrollbar_ & 1) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->hposition_ == 0)) && (local_78 <= (int)local_88)
        ))) {
      this->real_hposition_ = 0;
      uVar9 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar9 & 2) == 0) {
        (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar9 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar9 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar9 & 2) != 0) {
        (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar9 & 0xfffffffd;
        bbox(this,(int *)&local_7c,(int *)&local_80,(int *)&local_88,&local_8c);
        bVar4 = true;
      }
    }
    local_68 = iVar7;
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (iVar7 <= local_8c)))) {
      iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      this->top_ = (void *)CONCAT44(extraout_var_00,iVar7);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar9 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar9 & 2) == 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar9 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar9 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar9 & 2) != 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar9 & 0xfffffffd;
        bbox(this,(int *)&local_7c,(int *)&local_80,(int *)&local_88,&local_8c);
        bVar4 = true;
      }
    }
    bbox(this,(int *)&local_7c,(int *)&local_80,(int *)&local_88,&local_8c);
    uVar16 = local_7c;
    uVar9 = local_88;
    iVar8 = local_8c;
    uVar14 = (ulong)local_7c;
    local_60 = (ulong)local_80;
    uVar13 = (ulong)local_88;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])();
    pvVar12 = this->top_;
    iVar7 = -this->offset_;
    bVar2 = SBORROW4(iVar8,iVar7) == iVar8 + this->offset_ < 0;
    bVar3 = iVar8 != iVar7 && bVar2;
    local_84 = iVar8;
    local_70 = uVar13;
    if (pvVar12 != (void *)0x0 && (iVar8 != iVar7 && bVar2)) {
      local_74 = uVar9 + 1;
      local_64 = uVar16;
      do {
        uVar9 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar12);
        if (0 < (int)uVar9) {
          if (((((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x84) != 0) ||
              (pvVar12 == this->redraw1)) || (pvVar12 == this->redraw2)) {
            iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar12);
            uVar13 = local_70;
            if (iVar8 == 0) {
              iVar8 = (int)local_60;
              if (-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) {
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                          (fl_graphics_driver,(ulong)local_64,(ulong)(uint)(iVar8 + iVar7),local_70,
                           (ulong)uVar9);
                bVar6 = (this->super_Fl_Group).super_Fl_Widget.box_;
                if (bVar6 == 0) {
                  bVar6 = 3;
                }
                Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar6,
                                    (this->super_Fl_Group).super_Fl_Widget.x_,
                                    (this->super_Fl_Group).super_Fl_Widget.y_,
                                    (this->super_Fl_Group).super_Fl_Widget.w_,
                                    (this->super_Fl_Group).super_Fl_Widget.h_,
                                    (this->super_Fl_Group).super_Fl_Widget.color_);
                uVar14 = (ulong)local_64;
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
                iVar8 = (int)local_60;
              }
            }
            else {
              iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
              if (iVar8 == 0) {
                uVar16 = fl_inactive((this->super_Fl_Group).super_Fl_Widget.color2_);
              }
              else {
                uVar16 = (this->super_Fl_Group).super_Fl_Widget.color2_;
              }
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)uVar16);
              uVar13 = local_70;
              iVar8 = (int)local_60;
              uVar14 = (ulong)local_64;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                        (fl_graphics_driver,(ulong)local_64,(ulong)(uint)(iVar8 + iVar7),
                         local_70 & 0xffffffff,(ulong)uVar9);
              this = local_38;
            }
            iVar10 = (int)uVar14;
            uVar16 = iVar8 + iVar7;
            (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x11])
                      (this,pvVar12,(ulong)(uint)(iVar10 - this->hposition_),(ulong)uVar16,
                       (ulong)(uint)(this->hposition_ + (int)uVar13),(ulong)uVar9);
            if ((pvVar12 == this->selection_) && ((Fl_Browser_ *)Fl::focus_ == this)) {
              Fl_Widget::draw_box((Fl_Widget *)this,FL_BORDER_FRAME,iVar10,uVar16,(int)local_70,
                                  uVar9,(this->super_Fl_Group).super_Fl_Widget.color_);
              Fl_Widget::draw_focus((Fl_Widget *)this,FL_NO_BOX,iVar10,uVar16,local_74,uVar9 + 1);
            }
            iVar10 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xf])(this,pvVar12);
            iVar8 = local_84;
            if (this->max_width < iVar10) {
              this->max_width = iVar10;
              this->max_width_item = pvVar12;
            }
          }
          iVar7 = uVar9 + iVar7;
        }
        iVar10 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar12);
        pvVar12 = (void *)CONCAT44(extraout_var_01,iVar10);
        bVar3 = iVar7 < iVar8;
      } while ((pvVar12 != (void *)0x0) && (iVar7 < iVar8));
    }
    if ((-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) && (bVar3)) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,uVar14,(ulong)(uint)(iVar7 + (int)local_60),local_70,
                 (ulong)(uint)(local_84 - iVar7));
      bVar6 = (this->super_Fl_Group).super_Fl_Widget.box_;
      if (bVar6 == 0) {
        bVar6 = 3;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar6,(this->super_Fl_Group).super_Fl_Widget.x_,
                          (this->super_Fl_Group).super_Fl_Widget.y_,
                          (this->super_Fl_Group).super_Fl_Widget.w_,
                          (this->super_Fl_Group).super_Fl_Widget.h_,
                          (this->super_Fl_Group).super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
    pFVar5 = local_48;
    *local_40 = (void *)0x0;
    local_40[1] = (void *)0x0;
    iVar7 = local_68;
    if ((local_54 & 1) == 0) goto LAB_001a7fce;
    iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
    local_78 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])(this);
    bVar6 = this->has_scrollbar_;
    if (((bVar6 & 2) == 0) ||
       (((iVar7 <= local_84 && ((bVar6 & 4) == 0)) && (this->position_ == 0)))) {
      if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
      goto LAB_001a7f8a;
LAB_001a7fab:
      Fl_Widget::damage((Fl_Widget *)this,0x80);
      bVar3 = true;
    }
    else {
      if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
      goto LAB_001a7fab;
LAB_001a7f8a:
      if (((bVar6 & 1) == 0) ||
         (((local_78 <= (int)local_70 && ((bVar6 & 4) == 0)) && (this->hposition_ == 0)))) {
        if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
        goto LAB_001a7fce;
        goto LAB_001a7fab;
      }
      if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
      goto LAB_001a7fab;
LAB_001a7fce:
      local_68 = iVar7;
      uVar9 = this->scrollbar_size_;
      if (uVar9 == 0) {
        uVar9 = Fl::scrollbar_size();
      }
      iVar7 = local_68;
      if (this->top_ == (void *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this);
      }
      iVar10 = local_84;
      if (iVar8 < 0xb) {
        iVar8 = 10;
      }
      if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
        iVar15 = -uVar9;
        if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4)
            == 0) {
          iVar15 = (int)local_70;
        }
        local_74 = uVar9;
        Fl_Widget::damage_resize
                  ((Fl_Widget *)pFVar5,iVar15 + (int)uVar14,(int)local_60,uVar9,local_84);
        Fl_Slider::scrollvalue(pFVar5,this->position_,iVar10,0,iVar7);
        *(int *)&(this->scrollbar).super_Fl_Slider.field_0xac = iVar8;
        if (bVar4) {
          Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)pFVar5);
          uVar9 = local_74;
        }
        else {
          Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)pFVar5);
          uVar9 = local_74;
        }
      }
      pFVar5 = local_50;
      if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
        iVar10 = -uVar9;
        if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1)
            == 0) {
          iVar10 = local_84;
        }
        iVar15 = (int)local_70;
        Fl_Widget::damage_resize
                  ((Fl_Widget *)local_50,(int)uVar14,iVar10 + (int)local_60,iVar15,uVar9);
        Fl_Slider::scrollvalue(pFVar5,this->hposition_,iVar15,0,local_78);
        *(int *)&(this->hscrollbar).super_Fl_Slider.field_0xac = iVar8;
        if (bVar4) {
          Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)pFVar5);
        }
        else {
          Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)pFVar5);
        }
      }
      if (((bVar4) &&
          (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0))
         && (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)
         ) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,
                   (ulong)(((this->super_Fl_Group).super_Fl_Widget.parent_)->super_Fl_Widget).color_
                  );
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,
                   (ulong)(uint)(this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.
                                x_,
                   (ulong)(uint)(this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget
                                .y_,(ulong)uVar9,(ulong)uVar9);
      }
      this->real_hposition_ = this->hposition_;
      bVar3 = false;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    uVar11 = 0;
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void Fl_Browser_::draw() {
  int drawsquare = 0;
  update_top();
  int full_width_ = full_width();
  int full_height_ = full_height();
  int X, Y, W, H; bbox(X, Y, W, H);
  int dont_repeat = 0;
J1:
  if (damage() & FL_DAMAGE_ALL) { // redraw the box if full redraw
    Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
    draw_box(b, x(), y(), w(), h(), color());
    drawsquare = 1;
  }
  // see if scrollbar needs to be switched on/off:
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  if ((has_scrollbar_ & HORIZONTAL) && (
	(has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_ > W)) {
    if (!hscrollbar.visible()) {
      hscrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    real_hposition_ = 0;
    if (hscrollbar.visible()) {
      hscrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  // Check the vertical scrollbar again, just in case it needs to be drawn
  // because the horizontal one is drawn.  There should be a cleaner way
  // to do this besides copying the same code...
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  bbox(X, Y, W, H);

  fl_push_clip(X, Y, W, H);
  // for each line, draw it if full redraw or scrolled.  Erase background
  // if not a full redraw or if it is selected:
  void* l = top();
  int yy = -offset_;
  for (; l && yy < H; l = item_next(l)) {
    int hh = item_height(l);
    if (hh <= 0) continue;
    if ((damage()&(FL_DAMAGE_SCROLL|FL_DAMAGE_ALL)) || l == redraw1 || l == redraw2) {
      if (item_selected(l)) {
	fl_color(active_r() ? selection_color() : fl_inactive(selection_color()));
	fl_rectf(X, yy+Y, W, hh);
      } else if (!(damage()&FL_DAMAGE_ALL)) {
	fl_push_clip(X, yy+Y, W, hh);
	draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
	fl_pop_clip();
      }
      item_draw(l, X-hposition_, yy+Y, W+hposition_, hh);
      if (l == selection_ && Fl::focus() == this) {
	draw_box(FL_BORDER_FRAME, X, yy+Y, W, hh, color());
	draw_focus(FL_NO_BOX, X, yy+Y, W+1, hh+1);
      }
      int ww = item_width(l);
      if (ww > max_width) {max_width = ww; max_width_item = l;}
    }
    yy += hh;
  }
  // erase the area below last line:
  if (!(damage()&FL_DAMAGE_ALL) && yy < H) {
    fl_push_clip(X, yy+Y, W, H-yy);
    draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
    fl_pop_clip();
  }
  fl_pop_clip();

  fl_push_clip(x(),y(),w(),h());		// STR# 2886
  redraw1 = redraw2 = 0;
  if (!dont_repeat) {
    dont_repeat = 1;
    // see if changes to full_height caused by calls to slow_height
    // caused scrollbar state to change, in which case we have to redraw:
    full_height_ = full_height();
    full_width_ = full_width();
    if ((has_scrollbar_ & VERTICAL) &&
	((has_scrollbar_ & ALWAYS_ON) || position_ || full_height_>H)) {
      if (!scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
    if ((has_scrollbar_ & HORIZONTAL) &&
	((has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_>W)) {
      if (!hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
  }

  // update the scrollbars and redraw them:
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  int dy = top_ ? item_quick_height(top_) : 0; if (dy < 10) dy = 10;
  if (scrollbar.visible()) {
    scrollbar.damage_resize(
	scrollbar.align()&FL_ALIGN_LEFT ? X-scrollsize : X+W,
	Y, scrollsize, H);
    scrollbar.value(position_, H, 0, full_height_);
    scrollbar.linesize(dy);
    if (drawsquare) draw_child(scrollbar);
    else update_child(scrollbar);
  }
  if (hscrollbar.visible()) {
    hscrollbar.damage_resize(
	X, scrollbar.align()&FL_ALIGN_TOP ? Y-scrollsize : Y+H,
	W, scrollsize);
    hscrollbar.value(hposition_, W, 0, full_width_);
    hscrollbar.linesize(dy);
    if (drawsquare) draw_child(hscrollbar);
    else update_child(hscrollbar);
  }

  // draw that little square between the scrollbars:
  if (drawsquare && scrollbar.visible() && hscrollbar.visible()) {
    fl_color(parent()->color());
    fl_rectf(scrollbar.x(), hscrollbar.y(), scrollsize, scrollsize);
  }

  real_hposition_ = hposition_;
  fl_pop_clip();
}